

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

QByteArray * QByteArray::number(QByteArray *__return_storage_ptr__,uint n,int base)

{
  char *pcVar1;
  long in_FS_OFFSET;
  QByteArrayView v;
  char buff [66];
  char local_26 [14];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pcVar1 = qulltoa2(local_26,(ulong)n,base);
  v.m_data = pcVar1;
  v.m_size = (long)local_26 - (long)pcVar1;
  assign(__return_storage_ptr__,v);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QByteArray::number(uint n, int base)
{
    QByteArray s;
    s.setNum(n, base);
    return s;
}